

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backtrack.cc
# Opt level: O0

bool __thiscall
re2::Backtracker::Search
          (Backtracker *this,StringPiece *text,StringPiece *context,bool anchored,bool longest,
          StringPiece *submatch,int nsubmatch)

{
  StringPiece *pSVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  int iVar4;
  int iVar5;
  iterator pcVar6;
  iterator pcVar7;
  ostream *poVar8;
  ulong uVar9;
  uint32 *puVar10;
  byte bVar11;
  char *local_1f0;
  char *p;
  int local_1e0;
  undefined1 local_1d8 [8];
  StringPiece sp0;
  LogMessage local_1b8;
  StringPiece *local_38;
  StringPiece *submatch_local;
  bool longest_local;
  StringPiece *pSStack_28;
  bool anchored_local;
  StringPiece *context_local;
  StringPiece *text_local;
  Backtracker *this_local;
  
  (this->text_).ptr_ = text->ptr_;
  (this->text_).length_ = text->length_;
  (this->context_).ptr_ = context->ptr_;
  (this->context_).length_ = context->length_;
  local_38 = submatch;
  submatch_local._6_1_ = longest;
  submatch_local._7_1_ = anchored;
  pSStack_28 = context;
  context_local = text;
  text_local = (StringPiece *)this;
  pcVar6 = StringPiece::begin(&this->context_);
  if (pcVar6 == (iterator)0x0) {
    (this->context_).ptr_ = context_local->ptr_;
    (this->context_).length_ = context_local->length_;
  }
  bVar3 = Prog::anchor_start(this->prog_);
  if (bVar3) {
    pcVar6 = StringPiece::begin(context_local);
    pcVar7 = StringPiece::begin(&this->context_);
    if (pcVar7 < pcVar6) {
      return false;
    }
  }
  bVar3 = Prog::anchor_end(this->prog_);
  if (bVar3) {
    pcVar6 = StringPiece::end(context_local);
    pcVar7 = StringPiece::end(&this->context_);
    if (pcVar6 < pcVar7) {
      return false;
    }
  }
  bVar11 = submatch_local._7_1_ & 1;
  bVar3 = Prog::anchor_start(this->prog_);
  this->anchored_ = bVar11 != 0 || bVar3;
  bVar11 = submatch_local._6_1_ & 1;
  bVar3 = Prog::anchor_end(this->prog_);
  this->longest_ = bVar11 != 0 || bVar3;
  bVar3 = Prog::anchor_end(this->prog_);
  this->endmatch_ = bVar3;
  this->submatch_ = local_38;
  this->nsubmatch_ = nsubmatch;
  if (0x3f < this->nsubmatch_ * 2) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1b8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/backtrack.cc"
               ,0x72);
    poVar8 = LogMessage::stream(&local_1b8);
    std::operator<<(poVar8,"Check failed: 2*nsubmatch_ < arraysize(cap_)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b8);
  }
  memset(this->cap_,0,0x200);
  StringPiece::StringPiece((StringPiece *)local_1d8);
  if (nsubmatch < 1) {
    this->submatch_ = (StringPiece *)local_1d8;
    this->nsubmatch_ = 1;
  }
  StringPiece::StringPiece((StringPiece *)&p,(char *)0x0);
  pSVar1 = this->submatch_;
  pSVar1->ptr_ = p;
  pSVar1->length_ = local_1e0;
  if (this->visited_ != (uint32 *)0x0) {
    operator_delete__(this->visited_);
  }
  iVar4 = Prog::size(this->prog_);
  iVar5 = StringPiece::size(context_local);
  this->nvisited_ = (long)((iVar4 * (iVar5 + 1) + 0x1f) / 0x20);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = this->nvisited_;
  uVar9 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  puVar10 = (uint32 *)operator_new__(uVar9);
  this->visited_ = puVar10;
  memset(this->visited_,0,this->nvisited_ << 2);
  if ((this->anchored_ & 1U) == 0) {
    for (local_1f0 = StringPiece::begin(context_local); pcVar6 = StringPiece::end(context_local),
        local_1f0 <= pcVar6; local_1f0 = local_1f0 + 1) {
      this->cap_[0] = local_1f0;
      iVar4 = Prog::start(this->prog_);
      bVar3 = Visit(this,iVar4,local_1f0);
      if (bVar3) {
        return true;
      }
    }
    this_local._7_1_ = false;
  }
  else {
    pcVar6 = StringPiece::begin(context_local);
    this->cap_[0] = pcVar6;
    iVar4 = Prog::start(this->prog_);
    pcVar6 = StringPiece::begin(context_local);
    this_local._7_1_ = Visit(this,iVar4,pcVar6);
  }
  return this_local._7_1_;
}

Assistant:

bool Backtracker::Search(const StringPiece& text, const StringPiece& context,
                         bool anchored, bool longest,
                         StringPiece* submatch, int nsubmatch) {
  text_ = text;
  context_ = context;
  if (context_.begin() == NULL)
    context_ = text;
  if (prog_->anchor_start() && text.begin() > context_.begin())
    return false;
  if (prog_->anchor_end() && text.end() < context_.end())
    return false;
  anchored_ = anchored | prog_->anchor_start();
  longest_ = longest | prog_->anchor_end();
  endmatch_ = prog_->anchor_end();
  submatch_ = submatch;
  nsubmatch_ = nsubmatch;
  CHECK(2*nsubmatch_ < arraysize(cap_));
  memset(cap_, 0, sizeof cap_);

  // We use submatch_[0] for our own bookkeeping,
  // so it had better exist.
  StringPiece sp0;
  if (nsubmatch < 1) {
    submatch_ = &sp0;
    nsubmatch_ = 1;
  }
  submatch_[0] = NULL;

  // Allocate new visited_ bitmap -- size is proportional
  // to text, so have to reallocate on each call to Search.
  delete[] visited_;
  nvisited_ = (prog_->size()*(text.size()+1) + 31)/32;
  visited_ = new uint32[nvisited_];
  memset(visited_, 0, nvisited_*sizeof visited_[0]);

  // Anchored search must start at text.begin().
  if (anchored_) {
    cap_[0] = text.begin();
    return Visit(prog_->start(), text.begin());
  }

  // Unanchored search, starting from each possible text position.
  // Notice that we have to try the empty string at the end of
  // the text, so the loop condition is p <= text.end(), not p < text.end().
  for (const char* p = text.begin(); p <= text.end(); p++) {
    cap_[0] = p;
    if (Visit(prog_->start(), p))  // Match must be leftmost; done.
      return true;
  }
  return false;
}